

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v5::format_int::format_signed(format_int *this,longlong value)

{
  char *pcVar1;
  unsigned_long_long value_00;
  
  value_00 = -value;
  if (0 < value) {
    value_00 = value;
  }
  pcVar1 = format_decimal(this,value_00);
  this->str_ = pcVar1;
  if (value < 0) {
    this->str_ = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return;
}

Assistant:

void format_signed(long long value) {
    unsigned long long abs_value = static_cast<unsigned long long>(value);
    bool negative = value < 0;
    if (negative)
      abs_value = 0 - abs_value;
    str_ = format_decimal(abs_value);
    if (negative)
      *--str_ = '-';
  }